

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::error<unsigned_int&,int,unsigned_int_const&,char_const(&)[6],int>
          (ValidationContext *this,IssueError *issue,uint *args,int *args_1,uint *args_2,
          char (*args_3) [6],int *args_4)

{
  string_view fmt;
  format_args args_00;
  allocator<char> local_d1;
  undefined1 local_d0 [40];
  string local_a8;
  ulong local_88 [2];
  ulong local_78;
  ulong local_68;
  char (*local_58) [6];
  ulong local_48;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_d0[0] = (issue->super_Issue).type;
  local_d0._2_2_ = (issue->super_Issue).id;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(local_d0 + 8),&(issue->super_Issue).message,&local_d1);
  local_88[0] = (ulong)*args;
  local_78 = (ulong)(uint)*args_1;
  local_68 = (ulong)*args_2;
  local_48 = (ulong)(uint)*args_4;
  fmt.size_ = 0x1c212;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1._0_4_ = *args_2;
  args_00.desc_ = (unsigned_long_long)local_88;
  args_00.field_1._4_4_ = 0;
  local_58 = args_3;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_a8,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            (&this->callback,(ValidationReport *)local_d0);
  ValidationReport::~ValidationReport((ValidationReport *)local_d0);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }